

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

void generate_plus(chunk *c,wchar_t y1,wchar_t x1,wchar_t y2,wchar_t x2,wchar_t feat,wchar_t flag)

{
  loc lVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  if (c != (chunk *)0x0) {
    wVar3 = (x2 + x1) / 2;
    if (y1 <= y2) {
      wVar2 = y1;
      do {
        lVar1 = (loc)loc(wVar3,wVar2);
        square_set_feat((chunk_conflict *)c,lVar1,feat);
        wVar2 = wVar2 + L'\x01';
      } while (y2 + L'\x01' != wVar2);
    }
    wVar2 = (y2 + y1) / 2;
    generate_mark(c,y1,wVar3,y2,wVar3,L'\v');
    if (x1 <= x2) {
      wVar3 = x1;
      do {
        lVar1 = (loc)loc(wVar3,wVar2);
        square_set_feat((chunk_conflict *)c,lVar1,feat);
        wVar3 = wVar3 + L'\x01';
      } while (x2 + L'\x01' != wVar3);
    }
    generate_mark(c,wVar2,x1,wVar2,x2,L'\v');
    return;
  }
  __assert_fail("c",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                ,0x183,"void generate_plus(struct chunk *, int, int, int, int, int, int)");
}

Assistant:

static void generate_plus(struct chunk *c, int y1, int x1, int y2, int x2, 
						  int feat, int flag)
{
	int y, x;

	/* Find the center */
	int y0 = (y1 + y2) / 2;
	int x0 = (x1 + x2) / 2;

	assert(c);

	for (y = y1; y <= y2; y++) square_set_feat(c, loc(x0, y), feat);
	if (flag) generate_mark(c, y1, x0, y2, x0, flag);
	for (x = x1; x <= x2; x++) square_set_feat(c, loc(x, y0), feat);
	if (flag) generate_mark(c, y0, x1, y0, x2, flag);
}